

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::AllocateVertex(ON_SubD_FixedSizeHeap *this,ON_SubDEdge *edge0)

{
  ON_SubDEdgeTag OVar1;
  bool bVar2;
  uint uVar3;
  ON_SubDVertex *this_00;
  double subdP [3];
  double adStack_28 [3];
  
  if (((edge0 == (ON_SubDEdge *)0x0) ||
      (bVar2 = ON_SubDEdge::GetSubdivisionPoint(edge0,adStack_28), !bVar2)) ||
     (this_00 = AllocateVertex(this,adStack_28,4), this_00 == (ON_SubDVertex *)0x0)) {
    ON_SubDIncrementErrorCount();
    return (ON_SubDVertex *)0x0;
  }
  uVar3 = ON_SubDComponentBase::SubdivisionLevel(&edge0->super_ON_SubDComponentBase);
  ON_SubDComponentBase::SetSubdivisionLevel(&this_00->super_ON_SubDComponentBase,uVar3 + 1);
  OVar1 = edge0->m_edge_tag;
  if (OVar1 != SmoothX) {
    if (OVar1 == Crease) {
      this_00->m_vertex_tag = Crease;
      return this_00;
    }
    if (OVar1 != Smooth) {
      return this_00;
    }
  }
  this_00->m_vertex_tag = Smooth;
  return this_00;
}

Assistant:

ON_SubDVertex* ON_SubD_FixedSizeHeap::AllocateVertex(
  const ON_SubDEdge* edge0
  )
{
  if ( nullptr == edge0)
    return ON_SUBD_RETURN_ERROR(nullptr);

  double subdP[3];
  if (false == edge0->GetSubdivisionPoint(subdP))
    return ON_SUBD_RETURN_ERROR(nullptr);

  const unsigned int edge_capacity = 4;
  ON_SubDVertex* v1 = AllocateVertex(subdP, edge_capacity);
  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(nullptr);

  v1->SetSubdivisionLevel( edge0->SubdivisionLevel() + 1 );

  if (ON_SubDEdgeTag::Smooth == edge0->m_edge_tag || ON_SubDEdgeTag::SmoothX == edge0->m_edge_tag)
    v1->m_vertex_tag = ON_SubDVertexTag::Smooth;
  else if (ON_SubDEdgeTag::Crease == edge0->m_edge_tag)
    v1->m_vertex_tag = ON_SubDVertexTag::Crease;

  return v1;
}